

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

ull getbf(bitfield *bf,ull *a,ull *m,disctx *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar1 = bf->shr;
  lVar11 = 0;
  uVar6 = 0;
  iVar10 = iVar1;
  bVar5 = true;
  do {
    bVar9 = bVar5;
    iVar2 = bf->sbf[lVar11].pos;
    iVar4 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    iVar3 = bf->sbf[lVar11].len;
    uVar13 = ~(-1L << ((byte)iVar3 & 0x3f));
    bVar7 = (byte)(iVar2 % 0x40);
    uVar12 = uVar13 << (bVar7 & 0x3f);
    lVar11 = (long)(iVar4 >> 6);
    m[lVar11] = m[lVar11] | uVar12;
    uVar12 = (uVar12 & a[lVar11]) >> (bVar7 & 0x3f);
    if (0x40 < iVar2 % 0x40 + iVar3) {
      uVar13 = uVar13 >> (-bVar7 & 0x3f);
      m[lVar11 + 1] = m[lVar11 + 1] | uVar13;
      uVar12 = uVar12 | (uVar13 & a[lVar11 + 1]) << (-bVar7 & 0x3f);
    }
    uVar6 = uVar6 | uVar12 << ((byte)iVar10 & 0x3f);
    iVar10 = iVar10 + iVar3;
    lVar11 = 1;
    bVar5 = false;
  } while (bVar9);
  bVar7 = (byte)iVar10;
  switch(bf->mode) {
  case BF_SIGNED:
    bVar8 = bVar7 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar6 >> ((ulong)(byte)(bVar7 - 1) & 0x3f) & 1) == 0) goto switchD_0016b88a_default;
    bVar8 = bVar7 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_0016b88a_caseD_3;
  case BF_LUT:
    uVar6 = bf->lut[uVar6];
  default:
    goto switchD_0016b88a_default;
  }
  if ((uVar6 >> ((ulong)bVar8 & 0x3f) & 1) != 0) {
switchD_0016b88a_caseD_3:
    uVar6 = uVar6 + (-1L << (bVar7 & 0x3f));
  }
switchD_0016b88a_default:
  if (bf->pcrel != 0) {
    bVar7 = (byte)iVar1;
    uVar6 = uVar6 + (((ulong)ctx->pos + bf->pospreadd >> (bVar7 & 0x3f)) << (bVar7 & 0x3f));
  }
  return (uVar6 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m, struct disctx *ctx) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	if (bf->pcrel) {
		// <3 xtensa.
		res += (ctx->pos + bf->pospreadd) & -(1ull << bf->shr);
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}